

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

bool_t objIsOperable(void *obj)

{
  bool_t bVar1;
  void *in_RDI;
  size_t i;
  void *obj_00;
  bool_t local_4;
  
  bVar1 = objIsOperable2(in_RDI);
  if (bVar1 == 0) {
    local_4 = 0;
  }
  else {
    for (obj_00 = (void *)0x0; obj_00 < *(void **)((long)in_RDI + 0x10);
        obj_00 = (void *)((long)obj_00 + 1)) {
      bVar1 = objIsOperable(obj_00);
      if (bVar1 == 0) {
        return 0;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t objIsOperable(const void* obj)
{
	size_t i;
	// проверить сам объект
	if (!objIsOperable2(obj))
		return FALSE;
	// проверить ссылочные объекты
	for (i = 0; i < objOCount(obj); ++i)
		if (!objIsOperable(objCPtr(obj, i, void)))
			return FALSE;
	// все нормально
	return TRUE;
}